

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox_p.h
# Opt level: O0

void __thiscall QComboBoxPrivateScroller::~QComboBoxPrivateScroller(QComboBoxPrivateScroller *this)

{
  QComboBoxPrivateScroller *in_RDI;
  
  ~QComboBoxPrivateScroller(in_RDI);
  operator_delete(in_RDI,0x38);
  return;
}

Assistant:

class Q_AUTOTEST_EXPORT QComboBoxPrivateScroller : public QWidget
{
    Q_OBJECT

public:
    QComboBoxPrivateScroller(QAbstractSlider::SliderAction action, QWidget *parent)
        : QWidget(parent), sliderAction(action)
    {
        setSizePolicy(QSizePolicy::Minimum, QSizePolicy::Fixed);
        setAttribute(Qt::WA_NoMousePropagation);
    }